

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O1

void lshift8(void *blob,int nbytes,int c)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  undefined1 (*pauVar19) [64];
  ulong uVar20;
  long lVar21;
  uint8_t *k;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  
  if (c != 0) {
    uVar18 = c >> 3;
    if ((int)uVar18 < nbytes) {
      lVar21 = (long)nbytes;
      do {
        *(undefined1 *)((long)blob + lVar21 + -1) =
             *(undefined1 *)((long)blob + lVar21 + ~(long)(int)uVar18);
        lVar21 = lVar21 + -1;
      } while ((int)uVar18 < lVar21);
    }
    if (0 < (int)uVar18) {
      memset(blob,0,(ulong)uVar18);
    }
    if (0 < nbytes && (c & 7U) != 0) {
      auVar25 = vpbroadcastq_avx512f();
      auVar26 = vpaddq_avx512f(auVar25,_DAT_00187ac0);
      auVar27 = vpaddq_avx512f(auVar25,_DAT_00187b00);
      auVar28 = vpaddq_avx512f(auVar25,_DAT_00187b40);
      auVar29 = vpaddq_avx512f(auVar25,_DAT_00187b80);
      auVar30 = vpaddq_avx512f(auVar25,_DAT_00187bc0);
      auVar31 = vpaddq_avx512f(auVar25,_DAT_00187c00);
      auVar32 = vpaddq_avx512f(auVar25,_DAT_00187c40);
      auVar25 = vpaddq_avx512f(auVar25,_DAT_00187c80);
      auVar33 = vpbroadcastq_avx512f();
      pauVar19 = (undefined1 (*) [64])(((ulong)(nbytes - 1) - 0x3f) + (long)blob);
      uVar20 = 0;
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar42 = vmovdqa64_avx512f(_DAT_00187ec0);
      auVar24 = vpandq_avx512vl(ZEXT416((uint)c),_DAT_00188b40);
      auVar43 = vmovdqa64_avx512f(_DAT_00187f00);
      auVar44 = vpbroadcastq_avx512f(ZEXT816(0xffffffffffffffc0));
      do {
        auVar45 = vpbroadcastq_avx512f();
        auVar46 = vporq_avx512f(auVar45,auVar34);
        auVar47 = vporq_avx512f(auVar45,auVar35);
        auVar48 = vporq_avx512f(auVar45,auVar36);
        auVar49 = vporq_avx512f(auVar45,auVar37);
        auVar50 = vporq_avx512f(auVar45,auVar38);
        auVar51 = vporq_avx512f(auVar45,auVar39);
        auVar52 = vporq_avx512f(auVar45,auVar40);
        auVar45 = vporq_avx512f(auVar45,auVar41);
        uVar2 = vpcmpuq_avx512f(auVar45,auVar33,2);
        uVar3 = vpcmpuq_avx512f(auVar52,auVar33,2);
        uVar4 = vpcmpuq_avx512f(auVar51,auVar33,2);
        uVar5 = vpcmpuq_avx512f(auVar50,auVar33,2);
        uVar6 = vpcmpuq_avx512f(auVar49,auVar33,2);
        uVar7 = vpcmpuq_avx512f(auVar48,auVar33,2);
        uVar8 = vpcmpuq_avx512f(auVar47,auVar33,2);
        uVar9 = vpcmpuq_avx512f(auVar46,auVar33,2);
        uVar23 = CONCAT44(CONCAT22(CONCAT11((char)uVar9,(char)uVar8),
                                   CONCAT11((char)uVar7,(char)uVar6)),
                          CONCAT22(CONCAT11((char)uVar5,(char)uVar4),
                                   CONCAT11((char)uVar3,(char)uVar2)));
        auVar45 = vpmovm2b_avx512bw(uVar23);
        auVar45 = vpermb_avx512_vbmi(auVar42,auVar45);
        uVar22 = vpmovb2m_avx512bw(auVar45);
        auVar45 = vmovdqu8_avx512bw(*pauVar19);
        auVar46[1] = ((byte)(uVar22 >> 1) & 1) * auVar45[1];
        auVar46[0] = ((byte)uVar22 & 1) * auVar45[0];
        auVar46[2] = ((byte)(uVar22 >> 2) & 1) * auVar45[2];
        auVar46[3] = ((byte)(uVar22 >> 3) & 1) * auVar45[3];
        auVar46[4] = ((byte)(uVar22 >> 4) & 1) * auVar45[4];
        auVar46[5] = ((byte)(uVar22 >> 5) & 1) * auVar45[5];
        auVar46[6] = ((byte)(uVar22 >> 6) & 1) * auVar45[6];
        auVar46[7] = ((byte)(uVar22 >> 7) & 1) * auVar45[7];
        auVar46[8] = ((byte)(uVar22 >> 8) & 1) * auVar45[8];
        auVar46[9] = ((byte)(uVar22 >> 9) & 1) * auVar45[9];
        auVar46[10] = ((byte)(uVar22 >> 10) & 1) * auVar45[10];
        auVar46[0xb] = ((byte)(uVar22 >> 0xb) & 1) * auVar45[0xb];
        auVar46[0xc] = ((byte)(uVar22 >> 0xc) & 1) * auVar45[0xc];
        auVar46[0xd] = ((byte)(uVar22 >> 0xd) & 1) * auVar45[0xd];
        auVar46[0xe] = ((byte)(uVar22 >> 0xe) & 1) * auVar45[0xe];
        auVar46[0xf] = ((byte)(uVar22 >> 0xf) & 1) * auVar45[0xf];
        auVar46[0x10] = ((byte)(uVar22 >> 0x10) & 1) * auVar45[0x10];
        auVar46[0x11] = ((byte)(uVar22 >> 0x11) & 1) * auVar45[0x11];
        auVar46[0x12] = ((byte)(uVar22 >> 0x12) & 1) * auVar45[0x12];
        auVar46[0x13] = ((byte)(uVar22 >> 0x13) & 1) * auVar45[0x13];
        auVar46[0x14] = ((byte)(uVar22 >> 0x14) & 1) * auVar45[0x14];
        auVar46[0x15] = ((byte)(uVar22 >> 0x15) & 1) * auVar45[0x15];
        auVar46[0x16] = ((byte)(uVar22 >> 0x16) & 1) * auVar45[0x16];
        auVar46[0x17] = ((byte)(uVar22 >> 0x17) & 1) * auVar45[0x17];
        auVar46[0x18] = ((byte)(uVar22 >> 0x18) & 1) * auVar45[0x18];
        auVar46[0x19] = ((byte)(uVar22 >> 0x19) & 1) * auVar45[0x19];
        auVar46[0x1a] = ((byte)(uVar22 >> 0x1a) & 1) * auVar45[0x1a];
        auVar46[0x1b] = ((byte)(uVar22 >> 0x1b) & 1) * auVar45[0x1b];
        auVar46[0x1c] = ((byte)(uVar22 >> 0x1c) & 1) * auVar45[0x1c];
        auVar46[0x1d] = ((byte)(uVar22 >> 0x1d) & 1) * auVar45[0x1d];
        auVar46[0x1e] = ((byte)(uVar22 >> 0x1e) & 1) * auVar45[0x1e];
        auVar46[0x1f] = ((byte)(uVar22 >> 0x1f) & 1) * auVar45[0x1f];
        auVar46[0x20] = ((byte)(uVar22 >> 0x20) & 1) * auVar45[0x20];
        auVar46[0x21] = ((byte)(uVar22 >> 0x21) & 1) * auVar45[0x21];
        auVar46[0x22] = ((byte)(uVar22 >> 0x22) & 1) * auVar45[0x22];
        auVar46[0x23] = ((byte)(uVar22 >> 0x23) & 1) * auVar45[0x23];
        auVar46[0x24] = ((byte)(uVar22 >> 0x24) & 1) * auVar45[0x24];
        auVar46[0x25] = ((byte)(uVar22 >> 0x25) & 1) * auVar45[0x25];
        auVar46[0x26] = ((byte)(uVar22 >> 0x26) & 1) * auVar45[0x26];
        auVar46[0x27] = ((byte)(uVar22 >> 0x27) & 1) * auVar45[0x27];
        auVar46[0x28] = ((byte)(uVar22 >> 0x28) & 1) * auVar45[0x28];
        auVar46[0x29] = ((byte)(uVar22 >> 0x29) & 1) * auVar45[0x29];
        auVar46[0x2a] = ((byte)(uVar22 >> 0x2a) & 1) * auVar45[0x2a];
        auVar46[0x2b] = ((byte)(uVar22 >> 0x2b) & 1) * auVar45[0x2b];
        auVar46[0x2c] = ((byte)(uVar22 >> 0x2c) & 1) * auVar45[0x2c];
        auVar46[0x2d] = ((byte)(uVar22 >> 0x2d) & 1) * auVar45[0x2d];
        auVar46[0x2e] = ((byte)(uVar22 >> 0x2e) & 1) * auVar45[0x2e];
        auVar46[0x2f] = ((byte)(uVar22 >> 0x2f) & 1) * auVar45[0x2f];
        auVar46[0x30] = ((byte)(uVar22 >> 0x30) & 1) * auVar45[0x30];
        auVar46[0x31] = ((byte)(uVar22 >> 0x31) & 1) * auVar45[0x31];
        auVar46[0x32] = ((byte)(uVar22 >> 0x32) & 1) * auVar45[0x32];
        auVar46[0x33] = ((byte)(uVar22 >> 0x33) & 1) * auVar45[0x33];
        auVar46[0x34] = ((byte)(uVar22 >> 0x34) & 1) * auVar45[0x34];
        auVar46[0x35] = ((byte)(uVar22 >> 0x35) & 1) * auVar45[0x35];
        auVar46[0x36] = ((byte)(uVar22 >> 0x36) & 1) * auVar45[0x36];
        auVar46[0x37] = ((byte)(uVar22 >> 0x37) & 1) * auVar45[0x37];
        bVar1 = (byte)(uVar22 >> 0x38);
        auVar46[0x38] = (bVar1 & 1) * auVar45[0x38];
        auVar46[0x39] = (bVar1 >> 1 & 1) * auVar45[0x39];
        auVar46[0x3a] = (bVar1 >> 2 & 1) * auVar45[0x3a];
        auVar46[0x3b] = (bVar1 >> 3 & 1) * auVar45[0x3b];
        auVar46[0x3c] = (bVar1 >> 4 & 1) * auVar45[0x3c];
        auVar46[0x3d] = (bVar1 >> 5 & 1) * auVar45[0x3d];
        auVar46[0x3e] = (bVar1 >> 6 & 1) * auVar45[0x3e];
        auVar46[0x3f] = -((char)bVar1 >> 7) * auVar45[0x3f];
        auVar45 = vpermb_avx512_vbmi(auVar42,auVar46);
        uVar10 = vptestnmq_avx512f(auVar25,auVar25);
        uVar11 = vptestnmq_avx512f(auVar32,auVar32);
        uVar12 = vptestnmq_avx512f(auVar31,auVar31);
        uVar13 = vptestnmq_avx512f(auVar30,auVar30);
        uVar14 = vptestnmq_avx512f(auVar29,auVar29);
        uVar15 = vptestnmq_avx512f(auVar28,auVar28);
        uVar16 = vptestnmq_avx512f(auVar27,auVar27);
        uVar17 = vptestnmq_avx512f(auVar26,auVar26);
        uVar2 = vptestmq_avx512f(auVar25,auVar25);
        uVar3 = vptestmq_avx512f(auVar32,auVar32);
        uVar4 = vptestmq_avx512f(auVar31,auVar31);
        uVar5 = vptestmq_avx512f(auVar30,auVar30);
        uVar6 = vptestmq_avx512f(auVar29,auVar29);
        uVar7 = vptestmq_avx512f(auVar28,auVar28);
        uVar8 = vptestmq_avx512f(auVar27,auVar27);
        uVar9 = vptestmq_avx512f(auVar26,auVar26);
        auVar46 = vpmovm2b_avx512bw(uVar23 & CONCAT44(CONCAT22(CONCAT11((char)uVar9,(char)uVar8),
                                                               CONCAT11((char)uVar7,(char)uVar6)),
                                                      CONCAT22(CONCAT11((char)uVar5,(char)uVar4),
                                                               CONCAT11((char)uVar3,(char)uVar2))));
        auVar46 = vpermb_avx512_vbmi(auVar42,auVar46);
        uVar22 = vpmovb2m_avx512bw(auVar46);
        auVar46 = vmovdqu8_avx512bw(*(undefined1 (*) [64])(pauVar19[-1] + 0x3f));
        auVar47[1] = ((byte)(uVar22 >> 1) & 1) * auVar46[1];
        auVar47[0] = ((byte)uVar22 & 1) * auVar46[0];
        auVar47[2] = ((byte)(uVar22 >> 2) & 1) * auVar46[2];
        auVar47[3] = ((byte)(uVar22 >> 3) & 1) * auVar46[3];
        auVar47[4] = ((byte)(uVar22 >> 4) & 1) * auVar46[4];
        auVar47[5] = ((byte)(uVar22 >> 5) & 1) * auVar46[5];
        auVar47[6] = ((byte)(uVar22 >> 6) & 1) * auVar46[6];
        auVar47[7] = ((byte)(uVar22 >> 7) & 1) * auVar46[7];
        auVar47[8] = ((byte)(uVar22 >> 8) & 1) * auVar46[8];
        auVar47[9] = ((byte)(uVar22 >> 9) & 1) * auVar46[9];
        auVar47[10] = ((byte)(uVar22 >> 10) & 1) * auVar46[10];
        auVar47[0xb] = ((byte)(uVar22 >> 0xb) & 1) * auVar46[0xb];
        auVar47[0xc] = ((byte)(uVar22 >> 0xc) & 1) * auVar46[0xc];
        auVar47[0xd] = ((byte)(uVar22 >> 0xd) & 1) * auVar46[0xd];
        auVar47[0xe] = ((byte)(uVar22 >> 0xe) & 1) * auVar46[0xe];
        auVar47[0xf] = ((byte)(uVar22 >> 0xf) & 1) * auVar46[0xf];
        auVar47[0x10] = ((byte)(uVar22 >> 0x10) & 1) * auVar46[0x10];
        auVar47[0x11] = ((byte)(uVar22 >> 0x11) & 1) * auVar46[0x11];
        auVar47[0x12] = ((byte)(uVar22 >> 0x12) & 1) * auVar46[0x12];
        auVar47[0x13] = ((byte)(uVar22 >> 0x13) & 1) * auVar46[0x13];
        auVar47[0x14] = ((byte)(uVar22 >> 0x14) & 1) * auVar46[0x14];
        auVar47[0x15] = ((byte)(uVar22 >> 0x15) & 1) * auVar46[0x15];
        auVar47[0x16] = ((byte)(uVar22 >> 0x16) & 1) * auVar46[0x16];
        auVar47[0x17] = ((byte)(uVar22 >> 0x17) & 1) * auVar46[0x17];
        auVar47[0x18] = ((byte)(uVar22 >> 0x18) & 1) * auVar46[0x18];
        auVar47[0x19] = ((byte)(uVar22 >> 0x19) & 1) * auVar46[0x19];
        auVar47[0x1a] = ((byte)(uVar22 >> 0x1a) & 1) * auVar46[0x1a];
        auVar47[0x1b] = ((byte)(uVar22 >> 0x1b) & 1) * auVar46[0x1b];
        auVar47[0x1c] = ((byte)(uVar22 >> 0x1c) & 1) * auVar46[0x1c];
        auVar47[0x1d] = ((byte)(uVar22 >> 0x1d) & 1) * auVar46[0x1d];
        auVar47[0x1e] = ((byte)(uVar22 >> 0x1e) & 1) * auVar46[0x1e];
        auVar47[0x1f] = ((byte)(uVar22 >> 0x1f) & 1) * auVar46[0x1f];
        auVar47[0x20] = ((byte)(uVar22 >> 0x20) & 1) * auVar46[0x20];
        auVar47[0x21] = ((byte)(uVar22 >> 0x21) & 1) * auVar46[0x21];
        auVar47[0x22] = ((byte)(uVar22 >> 0x22) & 1) * auVar46[0x22];
        auVar47[0x23] = ((byte)(uVar22 >> 0x23) & 1) * auVar46[0x23];
        auVar47[0x24] = ((byte)(uVar22 >> 0x24) & 1) * auVar46[0x24];
        auVar47[0x25] = ((byte)(uVar22 >> 0x25) & 1) * auVar46[0x25];
        auVar47[0x26] = ((byte)(uVar22 >> 0x26) & 1) * auVar46[0x26];
        auVar47[0x27] = ((byte)(uVar22 >> 0x27) & 1) * auVar46[0x27];
        auVar47[0x28] = ((byte)(uVar22 >> 0x28) & 1) * auVar46[0x28];
        auVar47[0x29] = ((byte)(uVar22 >> 0x29) & 1) * auVar46[0x29];
        auVar47[0x2a] = ((byte)(uVar22 >> 0x2a) & 1) * auVar46[0x2a];
        auVar47[0x2b] = ((byte)(uVar22 >> 0x2b) & 1) * auVar46[0x2b];
        auVar47[0x2c] = ((byte)(uVar22 >> 0x2c) & 1) * auVar46[0x2c];
        auVar47[0x2d] = ((byte)(uVar22 >> 0x2d) & 1) * auVar46[0x2d];
        auVar47[0x2e] = ((byte)(uVar22 >> 0x2e) & 1) * auVar46[0x2e];
        auVar47[0x2f] = ((byte)(uVar22 >> 0x2f) & 1) * auVar46[0x2f];
        auVar47[0x30] = ((byte)(uVar22 >> 0x30) & 1) * auVar46[0x30];
        auVar47[0x31] = ((byte)(uVar22 >> 0x31) & 1) * auVar46[0x31];
        auVar47[0x32] = ((byte)(uVar22 >> 0x32) & 1) * auVar46[0x32];
        auVar47[0x33] = ((byte)(uVar22 >> 0x33) & 1) * auVar46[0x33];
        auVar47[0x34] = ((byte)(uVar22 >> 0x34) & 1) * auVar46[0x34];
        auVar47[0x35] = ((byte)(uVar22 >> 0x35) & 1) * auVar46[0x35];
        auVar47[0x36] = ((byte)(uVar22 >> 0x36) & 1) * auVar46[0x36];
        auVar47[0x37] = ((byte)(uVar22 >> 0x37) & 1) * auVar46[0x37];
        bVar1 = (byte)(uVar22 >> 0x38);
        auVar47[0x38] = (bVar1 & 1) * auVar46[0x38];
        auVar47[0x39] = (bVar1 >> 1 & 1) * auVar46[0x39];
        auVar47[0x3a] = (bVar1 >> 2 & 1) * auVar46[0x3a];
        auVar47[0x3b] = (bVar1 >> 3 & 1) * auVar46[0x3b];
        auVar47[0x3c] = (bVar1 >> 4 & 1) * auVar46[0x3c];
        auVar47[0x3d] = (bVar1 >> 5 & 1) * auVar46[0x3d];
        auVar47[0x3e] = (bVar1 >> 6 & 1) * auVar46[0x3e];
        auVar47[0x3f] = -((char)bVar1 >> 7) * auVar46[0x3f];
        uVar23 = ~(uVar23 & CONCAT44(CONCAT22(CONCAT11((char)uVar17,(char)uVar16),
                                              CONCAT11((char)uVar15,(char)uVar14)),
                                     CONCAT22(CONCAT11((char)uVar13,(char)uVar12),
                                              CONCAT11((char)uVar11,(char)uVar10))));
        auVar46 = vpermb_avx512_vbmi(auVar42,auVar47);
        auVar48[1] = ((byte)(uVar23 >> 1) & 1) * auVar46[1];
        auVar48[0] = ((byte)uVar23 & 1) * auVar46[0];
        auVar48[2] = ((byte)(uVar23 >> 2) & 1) * auVar46[2];
        auVar48[3] = ((byte)(uVar23 >> 3) & 1) * auVar46[3];
        auVar48[4] = ((byte)(uVar23 >> 4) & 1) * auVar46[4];
        auVar48[5] = ((byte)(uVar23 >> 5) & 1) * auVar46[5];
        auVar48[6] = ((byte)(uVar23 >> 6) & 1) * auVar46[6];
        auVar48[7] = ((byte)(uVar23 >> 7) & 1) * auVar46[7];
        auVar48[8] = ((byte)(uVar23 >> 8) & 1) * auVar46[8];
        auVar48[9] = ((byte)(uVar23 >> 9) & 1) * auVar46[9];
        auVar48[10] = ((byte)(uVar23 >> 10) & 1) * auVar46[10];
        auVar48[0xb] = ((byte)(uVar23 >> 0xb) & 1) * auVar46[0xb];
        auVar48[0xc] = ((byte)(uVar23 >> 0xc) & 1) * auVar46[0xc];
        auVar48[0xd] = ((byte)(uVar23 >> 0xd) & 1) * auVar46[0xd];
        auVar48[0xe] = ((byte)(uVar23 >> 0xe) & 1) * auVar46[0xe];
        auVar48[0xf] = ((byte)(uVar23 >> 0xf) & 1) * auVar46[0xf];
        auVar48[0x10] = ((byte)(uVar23 >> 0x10) & 1) * auVar46[0x10];
        auVar48[0x11] = ((byte)(uVar23 >> 0x11) & 1) * auVar46[0x11];
        auVar48[0x12] = ((byte)(uVar23 >> 0x12) & 1) * auVar46[0x12];
        auVar48[0x13] = ((byte)(uVar23 >> 0x13) & 1) * auVar46[0x13];
        auVar48[0x14] = ((byte)(uVar23 >> 0x14) & 1) * auVar46[0x14];
        auVar48[0x15] = ((byte)(uVar23 >> 0x15) & 1) * auVar46[0x15];
        auVar48[0x16] = ((byte)(uVar23 >> 0x16) & 1) * auVar46[0x16];
        auVar48[0x17] = ((byte)(uVar23 >> 0x17) & 1) * auVar46[0x17];
        auVar48[0x18] = ((byte)(uVar23 >> 0x18) & 1) * auVar46[0x18];
        auVar48[0x19] = ((byte)(uVar23 >> 0x19) & 1) * auVar46[0x19];
        auVar48[0x1a] = ((byte)(uVar23 >> 0x1a) & 1) * auVar46[0x1a];
        auVar48[0x1b] = ((byte)(uVar23 >> 0x1b) & 1) * auVar46[0x1b];
        auVar48[0x1c] = ((byte)(uVar23 >> 0x1c) & 1) * auVar46[0x1c];
        auVar48[0x1d] = ((byte)(uVar23 >> 0x1d) & 1) * auVar46[0x1d];
        auVar48[0x1e] = ((byte)(uVar23 >> 0x1e) & 1) * auVar46[0x1e];
        auVar48[0x1f] = ((byte)(uVar23 >> 0x1f) & 1) * auVar46[0x1f];
        auVar48[0x20] = ((byte)(uVar23 >> 0x20) & 1) * auVar46[0x20];
        auVar48[0x21] = ((byte)(uVar23 >> 0x21) & 1) * auVar46[0x21];
        auVar48[0x22] = ((byte)(uVar23 >> 0x22) & 1) * auVar46[0x22];
        auVar48[0x23] = ((byte)(uVar23 >> 0x23) & 1) * auVar46[0x23];
        auVar48[0x24] = ((byte)(uVar23 >> 0x24) & 1) * auVar46[0x24];
        auVar48[0x25] = ((byte)(uVar23 >> 0x25) & 1) * auVar46[0x25];
        auVar48[0x26] = ((byte)(uVar23 >> 0x26) & 1) * auVar46[0x26];
        auVar48[0x27] = ((byte)(uVar23 >> 0x27) & 1) * auVar46[0x27];
        auVar48[0x28] = ((byte)(uVar23 >> 0x28) & 1) * auVar46[0x28];
        auVar48[0x29] = ((byte)(uVar23 >> 0x29) & 1) * auVar46[0x29];
        auVar48[0x2a] = ((byte)(uVar23 >> 0x2a) & 1) * auVar46[0x2a];
        auVar48[0x2b] = ((byte)(uVar23 >> 0x2b) & 1) * auVar46[0x2b];
        auVar48[0x2c] = ((byte)(uVar23 >> 0x2c) & 1) * auVar46[0x2c];
        auVar48[0x2d] = ((byte)(uVar23 >> 0x2d) & 1) * auVar46[0x2d];
        auVar48[0x2e] = ((byte)(uVar23 >> 0x2e) & 1) * auVar46[0x2e];
        auVar48[0x2f] = ((byte)(uVar23 >> 0x2f) & 1) * auVar46[0x2f];
        auVar48[0x30] = ((byte)(uVar23 >> 0x30) & 1) * auVar46[0x30];
        auVar48[0x31] = ((byte)(uVar23 >> 0x31) & 1) * auVar46[0x31];
        auVar48[0x32] = ((byte)(uVar23 >> 0x32) & 1) * auVar46[0x32];
        auVar48[0x33] = ((byte)(uVar23 >> 0x33) & 1) * auVar46[0x33];
        auVar48[0x34] = ((byte)(uVar23 >> 0x34) & 1) * auVar46[0x34];
        auVar48[0x35] = ((byte)(uVar23 >> 0x35) & 1) * auVar46[0x35];
        auVar48[0x36] = ((byte)(uVar23 >> 0x36) & 1) * auVar46[0x36];
        auVar48[0x37] = ((byte)(uVar23 >> 0x37) & 1) * auVar46[0x37];
        bVar1 = (byte)(uVar23 >> 0x38);
        auVar48[0x38] = (bVar1 & 1) * auVar46[0x38];
        auVar48[0x39] = (bVar1 >> 1 & 1) * auVar46[0x39];
        auVar48[0x3a] = (bVar1 >> 2 & 1) * auVar46[0x3a];
        auVar48[0x3b] = (bVar1 >> 3 & 1) * auVar46[0x3b];
        auVar48[0x3c] = (bVar1 >> 4 & 1) * auVar46[0x3c];
        auVar48[0x3d] = (bVar1 >> 5 & 1) * auVar46[0x3d];
        auVar48[0x3e] = (bVar1 >> 6 & 1) * auVar46[0x3e];
        auVar48[0x3f] = -((char)bVar1 >> 7) * auVar46[0x3f];
        auVar46 = vpunpcklbw_avx512bw(auVar48,auVar45);
        auVar46 = vpsllw_avx512bw(auVar46,auVar24);
        auVar45 = vpunpckhbw_avx512bw(auVar48,auVar45);
        auVar45 = vpsllw_avx512bw(auVar45,auVar24);
        auVar45 = vpermt2b_avx512_vbmi(auVar45,auVar43,auVar46);
        auVar45 = vmovdqu8_avx512bw(auVar45);
        *pauVar19 = auVar45;
        uVar20 = uVar20 + 0x40;
        auVar25 = vpaddq_avx512f(auVar25,auVar44);
        auVar32 = vpaddq_avx512f(auVar32,auVar44);
        auVar31 = vpaddq_avx512f(auVar31,auVar44);
        auVar30 = vpaddq_avx512f(auVar30,auVar44);
        auVar29 = vpaddq_avx512f(auVar29,auVar44);
        auVar28 = vpaddq_avx512f(auVar28,auVar44);
        auVar27 = vpaddq_avx512f(auVar27,auVar44);
        auVar26 = vpaddq_avx512f(auVar26,auVar44);
        pauVar19 = pauVar19 + -1;
      } while ((nbytes + 0x3fU & 0xffffffc0) != uVar20);
    }
  }
  return;
}

Assistant:

void lshift8 ( void * blob, int nbytes, int c )
{
  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  int b = c >> 3;
  c &= 7;

  for(int i = nbytes-1; i >= b; i--)
  {
    k[i] = k[i-b];
  }

  for(int i = b-1; i >= 0; i--)
  {
    k[i] = 0;
  }

  if(c == 0) return;

  for(int i = nbytes-1; i >= 0; i--)
  {
    uint8_t a = k[i];
    uint8_t b = (i == 0) ? 0 : k[i-1];

    k[i] = (a << c) | (b >> (8-c));
  }
}